

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SuperCardPro.cpp
# Opt level: O2

bool __thiscall SuperCardPro::GetDriveStatus(SuperCardPro *this,int *status)

{
  bool bVar1;
  bool bVar2;
  uint16_t drv_status;
  
  bVar2 = false;
  bVar1 = SendCmd(this,0x8e,(void *)0x0,0,(void *)0x0,0);
  if (bVar1) {
    bVar1 = ReadExact(this,&drv_status,2);
    if (bVar1) {
      *status = (uint)(ushort)(drv_status << 8 | drv_status >> 8);
      bVar2 = true;
    }
    else {
      bVar2 = false;
    }
  }
  return bVar2;
}

Assistant:

bool SuperCardPro::GetDriveStatus(int& status)
{
    uint16_t drv_status;

    if (!SendCmd(CMD_STATUS))
        return false;

    if (!ReadExact(&drv_status, sizeof(drv_status)))
        return false;

    status = util::betoh(drv_status);

    return true;
}